

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerators::MakeParentDirectory(cmQtAutoGenerators *this,char *logPrefix,string *filename)

{
  undefined1 uVar1;
  ulong uVar2;
  string local_a0;
  allocator local_79;
  undefined1 local_78 [8];
  string error;
  undefined1 local_48 [8];
  string dirName;
  bool success;
  string *filename_local;
  char *logPrefix_local;
  cmQtAutoGenerators *this_local;
  
  dirName.field_2._M_local_buf[0xf] = '\x01';
  cmsys::SystemTools::GetFilenamePath((string *)local_48,filename);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (dirName.field_2._M_local_buf[0xf] = cmsys::SystemTools::MakeDirectory((string *)local_48),
     !(bool)dirName.field_2._M_local_buf[0xf])) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_78,logPrefix,&local_79);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::operator+=
              ((string *)local_78,": Error: Parent directory creation failed for ");
    Quoted(&local_a0,filename);
    std::__cxx11::string::operator+=((string *)local_78,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    LogError(this,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
  }
  uVar1 = dirName.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(uVar1 & 1);
}

Assistant:

bool cmQtAutoGenerators::MakeParentDirectory(const char* logPrefix,
                                             const std::string& filename) const
{
  bool success = true;
  const std::string dirName = cmSystemTools::GetFilenamePath(filename);
  if (!dirName.empty()) {
    success = cmsys::SystemTools::MakeDirectory(dirName);
    if (!success) {
      std::string error = logPrefix;
      error += ": Error: Parent directory creation failed for ";
      error += Quoted(filename);
      this->LogError(error);
    }
  }
  return success;
}